

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O3

char * SSL_get_signature_algorithm_name(uint16_t sigalg,int include_curve)

{
  long lVar1;
  
  if (include_curve == 0) {
    if (sigalg == 0x403) {
      return "ecdsa_sha256";
    }
    if (sigalg == 0x603) {
      return "ecdsa_sha512";
    }
    if (sigalg == 0x503) {
      return "ecdsa_sha384";
    }
  }
  lVar1 = 0;
  do {
    if (*(uint16_t *)(kSignatureAlgorithmNames[0].name + lVar1 + -2) == sigalg) {
      return kSignatureAlgorithmNames[0].name + lVar1;
    }
    lVar1 = lVar1 + 0x1a;
  } while (lVar1 != 0x16c);
  return (char *)0x0;
}

Assistant:

const char *SSL_get_signature_algorithm_name(uint16_t sigalg,
                                             int include_curve) {
  if (!include_curve) {
    switch (sigalg) {
      case SSL_SIGN_ECDSA_SECP256R1_SHA256:
        return "ecdsa_sha256";
      case SSL_SIGN_ECDSA_SECP384R1_SHA384:
        return "ecdsa_sha384";
      case SSL_SIGN_ECDSA_SECP521R1_SHA512:
        return "ecdsa_sha512";
        // If adding more here, also update
        // |SSL_get_all_signature_algorithm_names|.
    }
  }

  for (const auto &candidate : kSignatureAlgorithmNames) {
    if (candidate.signature_algorithm == sigalg) {
      return candidate.name;
    }
  }

  return NULL;
}